

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin-ratelimit.hh
# Opt level: O0

void __thiscall
discordpp::
PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>
::doCall(PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>
         *this)

{
  sptr<RenderedCall> *in_RSI;
  
  PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
  ::doCall((PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
            *)(this + *(long *)(*(long *)this + -0x48)),in_RSI);
  return;
}

Assistant:

virtual void doCall(sptr<RenderedCall> call) override {
        log::log(log::trace, [call](std::ostream *log) {
            *log << "Plugin: RateLimit: "
                 << "Intercepted " << *call->target;
            if (call->body) {
                *log << call->body;
            } else {
                *log << " with no body";
            }
            *log << '\n';
        });

        // Bundle the parameters together to pass them around easily
        // and calculate a hash of the route
        auto info = std::make_shared<CallInfo>(
            CallInfo{call, getLimitedRoute(*call->target)});

        log::log(log::trace, [info](std::ostream *log) {
            *log << "Hashes as " << info->route << '\n';
        });

        // Place the message in a bucket if possible,
        // otherwise place it on the global queue
        (route_to_bucket.count(info->route)
             ? buckets[route_to_bucket[info->route]].queues
             : queues)[info->route]
            .push(info);

        // Kickstart the send loop
        aioc->post([this] { do_some_work(); });
    }